

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImFontConfig_resizeT(ImVector_ImFontConfig *self,int new_size,ImFontConfig v)

{
  ImFontConfig *__dest;
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar1 / 2 + iVar1;
    }
    if (iVar1 <= new_size) {
      iVar1 = new_size;
    }
    __dest = (ImFontConfig *)ImGui::MemAlloc((long)iVar1 * 0x88);
    if (self->Data != (ImFontConfig *)0x0) {
      memcpy(__dest,self->Data,(long)self->Size * 0x88);
      ImGui::MemFree(self->Data);
    }
    self->Data = __dest;
    self->Capacity = iVar1;
  }
  iVar1 = self->Size;
  if (iVar1 < new_size) {
    lVar2 = (long)new_size - (long)iVar1;
    lVar3 = (long)iVar1 * 0x88;
    do {
      memcpy(self->Data->Name + lVar3 + -0x54,&v,0x88);
      lVar3 = lVar3 + 0x88;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontConfig_resizeT(ImVector_ImFontConfig* self,int new_size,const ImFontConfig v)
{
    return self->resize(new_size,v);
}